

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-heavy-traffic-deadlock-bug.c
# Opt level: O1

int ipc_helper_heavy_traffic_deadlock_bug(void)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  uv_stream_t *__size;
  uv_pipe_t pipe;
  uv_stream_t local_110;
  
  uVar2 = uv_default_loop();
  __size = &local_110;
  iVar1 = uv_pipe_init(uVar2,__size,1);
  if (iVar1 == 0) {
    __size = (uv_stream_t *)0x0;
    iVar1 = uv_pipe_open(&local_110);
    if (iVar1 == 0) {
      notify_parent_process();
      do_writes_and_reads(&local_110);
      uv_sleep(100);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      __size = (uv_stream_t *)0x0;
      uv_run(uVar2);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00161a75;
    }
  }
  else {
    ipc_helper_heavy_traffic_deadlock_bug_cold_1();
  }
  ipc_helper_heavy_traffic_deadlock_bug_cold_2();
LAB_00161a75:
  ipc_helper_heavy_traffic_deadlock_bug_cold_3();
  pvVar3 = malloc((size_t)__size);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = (long)(int)__size;
  return (int)__size;
}

Assistant:

int ipc_helper_heavy_traffic_deadlock_bug(void) {
  uv_pipe_t pipe;
  int r;

  r = uv_pipe_init(uv_default_loop(), &pipe, 1);
  ASSERT(r == 0);
  r = uv_pipe_open(&pipe, 0);
  ASSERT(r == 0);

  notify_parent_process();
  do_writes_and_reads((uv_stream_t*) &pipe);
  uv_sleep(100);

  MAKE_VALGRIND_HAPPY();
  return 0;
}